

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DFA.h
# Opt level: O2

void __thiscall
covenant::DFA_impl::distinctTable<bool>::distinctTable
          (distinctTable<bool> *this,uint n,bool init_val)

{
  ulong *puVar1;
  ulong uVar2;
  uint i;
  long lVar3;
  ulong uVar4;
  ulong __n;
  uint j;
  size_type __n_00;
  reference rVar5;
  allocator_type local_59;
  allocator_type local_58 [40];
  
  __n = (ulong)n;
  std::
  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  ::vector(&this->M,__n,local_58);
  for (lVar3 = 0; __n * 0x28 - lVar3 != 0; lVar3 = lVar3 + 0x28) {
    std::vector<bool,_std::allocator<bool>_>::vector
              ((vector<bool,_std::allocator<bool>_> *)local_58,__n,&local_59);
    std::vector<bool,_std::allocator<bool>_>::operator=
              ((vector<bool,_std::allocator<bool>_> *)
               ((long)&(((this->M).
                         super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super__Bvector_base<std::allocator<bool>_>)._M_impl + lVar3),
               (vector<bool,_std::allocator<bool>_> *)local_58);
    std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
              ((_Bvector_base<std::allocator<bool>_> *)local_58);
  }
  for (uVar4 = 0; uVar4 != __n; uVar4 = uVar4 + 1) {
    for (__n_00 = 0; __n != __n_00; __n_00 = __n_00 + 1) {
      rVar5 = std::vector<bool,_std::allocator<bool>_>::operator[]
                        ((this->M).
                         super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + uVar4,__n_00);
      puVar1 = rVar5._M_p;
      if (init_val) {
        uVar2 = rVar5._M_mask | *puVar1;
      }
      else {
        uVar2 = ~rVar5._M_mask & *puVar1;
      }
      *puVar1 = uVar2;
    }
  }
  return;
}

Assistant:

distinctTable(unsigned n, V init_val): M(n) 
       {
         for (unsigned i = 0; i < n; ++i)
           M[i] = vector<V>(n);
         
         for (unsigned i = 0; i < n; ++i)
         {
           for (unsigned j = 0; j < n; ++j)
             M[i][j]=init_val;
         }
       }